

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool mips_tr_breakpoint_check(DisasContextBase *dcbase,CPUState *cs,CPUBreakpoint *bp)

{
  TCGContext_conflict6 *tcg_ctx;
  
  tcg_ctx = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  save_cpu_state((DisasContext_conflict6 *)dcbase,1);
  dcbase->is_jmp = DISAS_NORETURN;
  gen_helper_raise_exception_debug(tcg_ctx,tcg_ctx->cpu_env);
  dcbase->pc_next = dcbase->pc_next + 4;
  return true;
}

Assistant:

static bool mips_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cs,
                                     const CPUBreakpoint *bp)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    save_cpu_state(ctx, 1);
    ctx->base.is_jmp = DISAS_NORETURN;
    gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
    /*
     * The address covered by the breakpoint must be included in
     * [tb->pc, tb->pc + tb->size) in order to for it to be
     * properly cleared -- thus we increment the PC here so that
     * the logic setting tb->size below does the right thing.
     */
    ctx->base.pc_next += 4;
    return true;
}